

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
::vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
         *this,size_t count,optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *value,
        polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>
        *alloc)

{
  bool bVar1;
  optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *poVar2;
  size_t sVar3;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    bVar1 = value->set;
    poVar2 = this->ptr;
    sVar3 = count;
    do {
      poVar2->set = bVar1;
      if ((bVar1 & 1U) != 0) {
        (poVar2->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
        (poVar2->optionalValue).__align = (value->optionalValue).__align;
        *(undefined8 *)((long)&poVar2->optionalValue + 8) =
             *(undefined8 *)((long)&value->optionalValue + 8);
      }
      poVar2 = poVar2 + 1;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }